

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_ApproximateEquivalencyTest_Test::
~MessageDifferencerTest_ApproximateEquivalencyTest_Test
          (MessageDifferencerTest_ApproximateEquivalencyTest_Test *this)

{
  MessageDifferencerTest_ApproximateEquivalencyTest_Test *this_local;
  
  ~MessageDifferencerTest_ApproximateEquivalencyTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, ApproximateEquivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  // Compare
  EXPECT_TRUE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));
}